

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pipe.c
# Opt level: O2

void nni_plat_pipe_clear(int rfd)

{
  ssize_t sVar1;
  undefined1 local_48 [8];
  char buf [32];
  
  do {
    sVar1 = read(rfd,local_48,0x20);
  } while (0 < sVar1);
  return;
}

Assistant:

void
nni_plat_pipe_clear(int rfd)
{
	char buf[32];

	for (;;) {
		// Completely drain the pipe, but don't wait.  This coalesces
		// events somewhat.
		if (read(rfd, buf, sizeof(buf)) <= 0) {
			return;
		}
	}
}